

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::HilbertCurve<2L>,_std::shared_ptr<anurbs::HilbertCurve<2L>_>_> * __thiscall
pybind11::class_<anurbs::HilbertCurve<2l>,std::shared_ptr<anurbs::HilbertCurve<2l>>>::
def_static<unsigned_long(*)(unsigned_long,unsigned_long)noexcept>
          (class_<anurbs::HilbertCurve<2l>,std::shared_ptr<anurbs::HilbertCurve<2l>>> *this,
          char *name_,_func_unsigned_long_unsigned_long_unsigned_long **f)

{
  _func_unsigned_long_unsigned_long_unsigned_long *f_00;
  handle local_a8;
  PyObject *local_a0;
  obj_attr_accessor local_98;
  staticmethod local_78 [3];
  handle local_60;
  PyObject *local_58;
  handle local_50;
  handle local_48;
  sibling local_40;
  scope local_38;
  name local_30;
  cpp_function local_28;
  cpp_function cf;
  _func_unsigned_long_unsigned_long_unsigned_long **f_local;
  char *name__local;
  class_<anurbs::HilbertCurve<2L>,_std::shared_ptr<anurbs::HilbertCurve<2L>_>_> *this_local;
  
  f_00 = *f;
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)f;
  pybind11::name::name(&local_30,name_);
  pybind11::scope::scope(&local_38,(handle *)this);
  local_50.m_ptr = *(PyObject **)this;
  none::none((none *)&local_60);
  local_58 = local_60.m_ptr;
  getattr((pybind11 *)&local_48,local_50,name_,local_60);
  sibling::sibling(&local_40,&local_48);
  cpp_function::
  cpp_function<unsigned_long,unsigned_long,unsigned_long,pybind11::name,pybind11::scope,pybind11::sibling>
            (&local_28,f_00,&local_30,&local_38,&local_40);
  pybind11::object::~object((object *)&local_48);
  none::~none((none *)&local_60);
  staticmethod::staticmethod(local_78,(object *)&local_28);
  cpp_function::name((cpp_function *)&local_a8);
  local_a0 = local_a8.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_98,(object_api<pybind11::handle> *)this,local_a8);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_98,local_78);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_98);
  pybind11::object::~object((object *)&local_a8);
  staticmethod::~staticmethod(local_78);
  cpp_function::~cpp_function(&local_28);
  return (class_<anurbs::HilbertCurve<2L>,_std::shared_ptr<anurbs::HilbertCurve<2L>_>_> *)this;
}

Assistant:

class_ &
    def_static(const char *name_, Func &&f, const Extra&... extra) {
        static_assert(!std::is_member_function_pointer<Func>::value,
                "def_static(...) called with a non-static member function pointer");
        cpp_function cf(std::forward<Func>(f), name(name_), scope(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = staticmethod(cf);
        return *this;
    }